

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darMan.c
# Opt level: O0

Dar_Man_t * Dar_ManStart(Aig_Man_t *pAig,Dar_RwrPar_t *pPars)

{
  Dar_Man_t *__s;
  Vec_Ptr_t *pVVar1;
  Aig_MmFixed_t *pAVar2;
  Dar_Man_t *p;
  Dar_RwrPar_t *pPars_local;
  Aig_Man_t *pAig_local;
  
  Aig_ManCleanData(pAig);
  __s = (Dar_Man_t *)malloc(0xb08);
  memset(__s,0,0xb08);
  __s->pPars = pPars;
  __s->pAig = pAig;
  pVVar1 = Vec_PtrAlloc(1000);
  __s->vCutNodes = pVVar1;
  pAVar2 = Aig_MmFixedStart(__s->pPars->nCutsMax * 0x18,0x400);
  __s->pMemCuts = pAVar2;
  pVVar1 = Vec_PtrAlloc(4);
  __s->vLeavesBest = pVVar1;
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the rewriting manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Dar_Man_t * Dar_ManStart( Aig_Man_t * pAig, Dar_RwrPar_t * pPars )
{
    Dar_Man_t * p;
    Aig_ManCleanData( pAig );
    p = ABC_ALLOC( Dar_Man_t, 1 );
    memset( p, 0, sizeof(Dar_Man_t) );
    p->pPars = pPars;
    p->pAig  = pAig;
    p->vCutNodes = Vec_PtrAlloc( 1000 );
    p->pMemCuts = Aig_MmFixedStart( p->pPars->nCutsMax * sizeof(Dar_Cut_t), 1024 );
    p->vLeavesBest = Vec_PtrAlloc( 4 );
    return p;
}